

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

string * __thiscall
bloaty::wasm::WebAssemblyObjectFile::GetBuildId_abi_cxx11_(WebAssemblyObjectFile *this)

{
  string_view file;
  InputFile *this_00;
  char *in_RSI;
  string *in_RDI;
  string_view sVar1;
  string *id;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  this_00 = ObjectFile::file_data((ObjectFile *)0x1e5e98);
  sVar1 = InputFile::data(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  file._M_len._7_1_ = uVar2;
  file._M_len._0_7_ = in_stack_ffffffffffffffe8;
  file._M_str = in_RSI;
  FindSection<bloaty::wasm::WebAssemblyObjectFile::GetBuildId[abi:cxx11]()const::_lambda(bloaty::wasm::Section&)_1_>
            (file,(string *)sVar1._M_str,(anon_class_8_1_3fcf65d9 *)sVar1._M_len);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  return in_RDI;
}

Assistant:

std::string GetBuildId() const override {
    // Use the sourceMappingURL as the build ID to be able to match to the
    // source map.
    std::string id;

    FindSection(file_data().data(), "sourceMappingURL",
                [&id](Section& section) {
                  uint32_t size = ReadVarUInt32(&section.contents);
                  string_view source_mapping_url =
                      ReadPiece(size, &section.contents);
                  id.assign(source_mapping_url);
                });

    return id;
  }